

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_image_section_cache.c
# Opt level: O1

int pt_iscache_find(pt_image_section_cache *iscache,char *filename,uint64_t offset,uint64_t size,
                   uint64_t laddr)

{
  ushort uVar1;
  pt_iscache_entry *ppVar2;
  pt_section *section;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *__s1;
  uint64_t uVar7;
  uint64_t uVar8;
  long lVar9;
  int local_64;
  
  if (iscache == (pt_image_section_cache *)0x0) {
    iVar5 = -1;
  }
  else {
    iVar4 = mtx_lock(&iscache->lock);
    iVar5 = -0x12;
    if (iVar4 == 0) {
      iVar5 = 0;
    }
  }
  if (-1 < iVar5) {
    iVar5 = -1;
    if (filename != (char *)0x0 && iscache != (pt_image_section_cache *)0x0) {
      uVar1 = iscache->size;
      if (uVar1 == 0) {
        iVar5 = 0;
      }
      else {
        iVar4 = 1;
        lVar9 = 0;
        do {
          ppVar2 = iscache->entries;
          section = *(pt_section **)((long)&ppVar2->section + lVar9);
          __s1 = pt_section_filename(section);
          uVar7 = pt_section_offset(section);
          uVar8 = pt_section_size(section);
          bVar3 = true;
          if (((*(uint64_t *)((long)&ppVar2->laddr + lVar9) == laddr) && (uVar7 == offset)) &&
             (uVar8 == size)) {
            if (__s1 == (char *)0x0) {
              local_64 = -1;
              bVar3 = false;
            }
            else {
              iVar5 = strcmp(__s1,filename);
              if (iVar5 == 0) {
                bVar3 = false;
                local_64 = iVar4;
              }
            }
          }
          iVar5 = local_64;
          if (!bVar3) goto LAB_0010bd0a;
          iVar4 = iVar4 + 1;
          lVar9 = lVar9 + 0x10;
        } while ((ulong)uVar1 << 4 != lVar9);
        iVar5 = 0;
      }
    }
LAB_0010bd0a:
    iVar4 = -1;
    if (iscache != (pt_image_section_cache *)0x0) {
      iVar6 = mtx_unlock(&iscache->lock);
      iVar4 = -0x12;
      if (iVar6 == 0) {
        iVar4 = 0;
      }
    }
    if (iVar4 < 0) {
      iVar5 = iVar4;
    }
  }
  return iVar5;
}

Assistant:

int pt_iscache_find(struct pt_image_section_cache *iscache,
		    const char *filename, uint64_t offset, uint64_t size,
		    uint64_t laddr)
{
	int errcode, isid;

	errcode = pt_iscache_lock(iscache);
	if (errcode < 0)
		return errcode;

	isid = pt_iscache_find_locked(iscache, filename, offset, size, laddr);

	errcode = pt_iscache_unlock(iscache);
	if (errcode < 0)
		return errcode;

	return isid;
}